

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boolean.c
# Opt level: O1

int lyplg_type_sort_boolean(ly_ctx *UNUSED_ctx,lyd_value *val1,lyd_value *val2)

{
  int iVar1;
  
  iVar1 = 1;
  if ((val1->field_2).boolean <= (val2->field_2).boolean) {
    iVar1 = -(uint)((val1->field_2).boolean < (val2->field_2).boolean);
  }
  return iVar1;
}

Assistant:

LIBYANG_API_DEF int
lyplg_type_sort_boolean(const struct ly_ctx *UNUSED(ctx), const struct lyd_value *val1, const struct lyd_value *val2)
{
    if (val1->boolean > val2->boolean) {
        return 1;
    } else if (val1->boolean < val2->boolean) {
        return -1;
    } else {
        return 0;
    }
}